

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

ps_seg_t * ps_seg_iter(ps_decoder_t *ps)

{
  ps_seg_t *ppVar1;
  
  if (ps->search == (ps_search_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x582,
            "No search module is selected, did you forget to specify a language model or grammar?\n"
           );
    ppVar1 = (ps_seg_t *)0x0;
  }
  else {
    ptmr_start(&ps->perf);
    ppVar1 = (*ps->search->vt->seg_iter)(ps->search);
    ptmr_stop(&ps->perf);
  }
  return ppVar1;
}

Assistant:

ps_seg_t *
ps_seg_iter(ps_decoder_t *ps)
{
    ps_seg_t *itor;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return NULL;
    }
    ptmr_start(&ps->perf);
    itor = ps_search_seg_iter(ps->search);
    ptmr_stop(&ps->perf);
    return itor;
}